

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
          *field)

{
  DataSegmentModuleField *pDVar1;
  iterator __position;
  long lVar2;
  ModuleFieldList *pMVar3;
  DataSegment *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pDVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
  if (*(long *)(pDVar1 + 0x50) != 0) {
    local_48 = *(DataSegment **)(pDVar1 + 0x18);
    uStack_40 = *(undefined4 *)(pDVar1 + 0x20);
    uStack_3c = *(undefined4 *)(pDVar1 + 0x24);
    local_38 = *(undefined4 *)(pDVar1 + 0x28);
    uStack_34 = *(undefined4 *)(pDVar1 + 0x2c);
    uStack_30 = *(undefined4 *)(pDVar1 + 0x30);
    uStack_2c = *(undefined4 *)(pDVar1 + 0x34);
    local_28 = (undefined4)
               ((ulong)(*(long *)&this->field_0x150 - *(long *)&this->data_segments) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->data_segment_bindings,0,pDVar1 + 0x48);
  }
  local_48 = (DataSegment *)(pDVar1 + 0x40);
  __position._M_current = *(DataSegment ***)&this->field_0x150;
  if (__position._M_current == *(DataSegment ***)&this->field_0x158) {
    std::vector<wabt::DataSegment*,std::allocator<wabt::DataSegment*>>::
    _M_realloc_insert<wabt::DataSegment*>
              ((vector<wabt::DataSegment*,std::allocator<wabt::DataSegment*>> *)&this->data_segments
               ,__position,&local_48);
  }
  else {
    *__position._M_current = local_48;
    *(long *)&this->field_0x150 = *(long *)&this->field_0x150 + 8;
  }
  pDVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
           .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (DataSegmentModuleField *)0x0;
  if ((*(long *)(pDVar1 + 0x10) == 0) && (*(long *)(pDVar1 + 8) == 0)) {
    lVar2 = *(long *)&this->field_0x48;
    if (lVar2 == 0) {
      pMVar3 = &this->fields;
    }
    else {
      *(long *)(pDVar1 + 0x10) = lVar2;
      pMVar3 = (ModuleFieldList *)(lVar2 + 8);
    }
    *(DataSegmentModuleField **)pMVar3 = pDVar1;
    *(DataSegmentModuleField **)&this->field_0x48 = pDVar1;
    *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<DataSegmentModuleField> field) {
  DataSegment& data_segment = field->data_segment;
  if (!data_segment.name.empty()) {
    data_segment_bindings.emplace(data_segment.name,
                                  Binding(field->loc, data_segments.size()));
  }
  data_segments.push_back(&data_segment);
  fields.push_back(std::move(field));
}